

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * __thiscall
testing::internal::PrintTestPartResultToString_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,TestPartResult *test_part_result)

{
  uint uVar1;
  Type type;
  internal *this_00;
  Message *pMVar2;
  int in_ECX;
  long in_FS_OFFSET;
  TestPartResult *test_part_result_local;
  char *local_48;
  char *local_40;
  Message local_38;
  string local_30;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  Message::Message(&local_38);
  this_00 = (internal *)TestPartResult::file_name((TestPartResult *)this);
  uVar1 = TestPartResult::line_number((TestPartResult *)this);
  FormatFileLocation_abi_cxx11_(&local_30,this_00,(char *)(ulong)uVar1,in_ECX);
  pMVar2 = Message::operator<<(&local_38,&local_30);
  pMVar2 = Message::operator<<(pMVar2,(char (*) [2])0x1ea514);
  type = TestPartResult::type((TestPartResult *)this);
  local_40 = TestPartResultTypeToString(type);
  pMVar2 = Message::operator<<(pMVar2,&local_40);
  local_48 = TestPartResult::message((TestPartResult *)this);
  pMVar2 = Message::operator<<(pMVar2,&local_48);
  Message::GetString_abi_cxx11_(__return_storage_ptr__,pMVar2);
  std::__cxx11::string::~string((string *)&local_30);
  Message::~Message(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static std::string PrintTestPartResultToString(
    const TestPartResult& test_part_result) {
  return (Message()
          << internal::FormatFileLocation(test_part_result.file_name(),
                                          test_part_result.line_number())
          << " " << TestPartResultTypeToString(test_part_result.type())
          << test_part_result.message()).GetString();
}